

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-bind.c
# Opt level: O1

int run_test_udp_bind_reuseaddr(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *loop;
  uv_handle_t *handle;
  int64_t eval_b_1;
  int64_t eval_b_2;
  sockaddr_in addr;
  uv_udp_t h2;
  uv_udp_t h1;
  undefined1 local_198 [32];
  uv_udp_t local_178;
  uv_udp_t local_c0;
  
  handle = (uv_handle_t *)local_198;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,(sockaddr_in *)(local_198 + 0x10));
  local_c0.data = (void *)(long)iVar1;
  local_178.data = (uv__queue *)0x0;
  if (local_c0.data == (void *)0x0) {
    loop = uv_default_loop();
    iVar1 = uv_udp_init(loop,&local_c0);
    local_178.data = (void *)(long)iVar1;
    local_198._0_8_ = (uv_loop_t *)0x0;
    if ((uv__queue *)local_178.data != (uv__queue *)0x0) goto LAB_001d62c4;
    iVar1 = uv_udp_init(loop,&local_178);
    local_198._0_8_ = SEXT48(iVar1);
    local_198._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_198._0_8_ != (uv_loop_t *)0x0) goto LAB_001d62d1;
    iVar1 = uv_udp_bind(&local_c0,(sockaddr *)(local_198 + 0x10),4);
    local_198._0_8_ = SEXT48(iVar1);
    local_198._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_198._0_8_ != (uv_loop_t *)0x0) goto LAB_001d62de;
    iVar1 = uv_udp_bind(&local_178,(sockaddr *)(local_198 + 0x10),4);
    local_198._0_8_ = SEXT48(iVar1);
    local_198._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_198._0_8_ != (uv_loop_t *)0x0) goto LAB_001d62eb;
    uv_close((uv_handle_t *)&local_c0,(uv_close_cb)0x0);
    uv_close((uv_handle_t *)&local_178,(uv_close_cb)0x0);
    iVar1 = uv_run(loop,UV_RUN_DEFAULT);
    local_198._0_8_ = SEXT48(iVar1);
    local_198._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_198._0_8_ == (uv_loop_t *)0x0) {
      uv_walk(loop,close_walk_cb,(void *)0x0);
      uv_run(loop,UV_RUN_DEFAULT);
      local_198._0_8_ = (uv_loop_t *)0x0;
      iVar1 = uv_loop_close(loop);
      local_198._8_8_ = SEXT48(iVar1);
      if (local_198._0_8_ == local_198._8_8_) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001d6305;
    }
  }
  else {
    run_test_udp_bind_reuseaddr_cold_1();
LAB_001d62c4:
    run_test_udp_bind_reuseaddr_cold_2();
LAB_001d62d1:
    run_test_udp_bind_reuseaddr_cold_3();
LAB_001d62de:
    run_test_udp_bind_reuseaddr_cold_4();
LAB_001d62eb:
    run_test_udp_bind_reuseaddr_cold_5();
  }
  run_test_udp_bind_reuseaddr_cold_6();
LAB_001d6305:
  run_test_udp_bind_reuseaddr_cold_7();
  iVar1 = uv_is_closing(handle);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close(handle,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(udp_bind_reuseaddr) {
  struct sockaddr_in addr;
  uv_loop_t* loop;
  uv_udp_t h1, h2;
  int r;

  ASSERT_OK(uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

  loop = uv_default_loop();

  r = uv_udp_init(loop, &h1);
  ASSERT_OK(r);

  r = uv_udp_init(loop, &h2);
  ASSERT_OK(r);

  r = uv_udp_bind(&h1, (const struct sockaddr*) &addr, UV_UDP_REUSEADDR);
  ASSERT_OK(r);

  r = uv_udp_bind(&h2, (const struct sockaddr*) &addr, UV_UDP_REUSEADDR);
  ASSERT_OK(r);

  uv_close((uv_handle_t*) &h1, NULL);
  uv_close((uv_handle_t*) &h2, NULL);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_OK(r);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}